

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YinYang.cpp
# Opt level: O3

void __thiscall YinYang::YinYang(YinYang *this,double radius)

{
  Parameterization::Parameterization(&this->super_Parameterization,radius);
  (this->super_Parameterization)._vptr_Parameterization =
       (_func_int **)&PTR_PrintPlot3DHeader_00107cf8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Parameterization).name,0,
             (char *)(this->super_Parameterization).name._M_string_length,0x1062b0);
  (this->super_Parameterization).Jmax = 0x78;
  (this->super_Parameterization).Kmax = 0x3c;
  (this->super_Parameterization).Lmax = 1;
  (this->super_Parameterization).Gmax = 2;
  this->theta1_lb = 0.7853981633974483;
  this->theta1_ub = 5.497787143782138;
  this->theta2_lb = 0.6283185307179586;
  this->theta2_ub = 2.5132741228718345;
  this->d_theta1 = 0.03959990739819067;
  this->d_theta2 = 0.031948399867014844;
  return;
}

Assistant:

YinYang::YinYang(double radius) : Parameterization(radius) {
  name = "YinYang";

  Jmax = 120;
  Kmax = 60;
  Lmax = 1;
  Gmax = 2;

  // Angle in the xy-plane
  theta1_lb = (1.0e0 / 4.0e0) * PI;
  theta1_ub = (7.0e0 / 4.0e0) * PI;
  //theta1_lb = -(3.0e0 / 4.0e0) * PI;
  //theta1_ub = (3.0e0 / 4.0e0) * PI;

  d_theta1 = (theta1_ub - theta1_lb) / (double)(Jmax - 1);

  // Angle between positive z-axis and radius.
  //theta2_lb = (1.0e0 / 4.0e0) * PI;
  //theta2_ub = (3.0e0 / 4.0e0) * PI;
  theta2_lb = (1.0e0 / 5.0e0) * PI;
  theta2_ub = (4.0e0 / 5.0e0) * PI;

  d_theta2 = (theta2_ub - theta2_lb) / (double)(Kmax - 1);
}